

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.cpp
# Opt level: O0

void __thiscall DSDcc::DSDDstar::DSDDstar(DSDDstar *this,DSDDecoder *dsdDecoder)

{
  undefined8 in_RSI;
  EVP_PKEY_CTX *ctx;
  CRC *in_RDI;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar1;
  uint in_stack_ffffffffffffffb4;
  unsigned_long in_stack_ffffffffffffffb8;
  Viterbi3 *in_stack_ffffffffffffffc0;
  unsigned_long *polynomial;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe8;
  
  *(undefined8 *)in_RDI = in_RSI;
  *(undefined4 *)&in_RDI->m_poly = 0;
  *(undefined4 *)((long)&in_RDI->m_poly + 4) = 0;
  in_RDI->m_direct = 0;
  *(undefined4 *)&in_RDI->field_0x14 = 0;
  polynomial = &in_RDI->m_crcinit;
  Viterbi3::Viterbi3(in_stack_ffffffffffffffc0,(int)(in_stack_ffffffffffffffb8 >> 0x20),
                     (uint *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     SUB41((uint)in_stack_ffffffffffffffac >> 0x18,0));
  DStarCRC::DStarCRC((DStarCRC *)(in_RDI->m_crctab + 4));
  ctx = (EVP_PKEY_CTX *)0x8408;
  uVar1 = 0;
  CRC::CRC(in_RDI,(unsigned_long)polynomial,(int)((ulong)(in_RDI->m_crctab + 5) >> 0x20),
           in_stack_ffffffffffffffb8,(ulong)in_stack_ffffffffffffffb4 << 0x20,
           in_stack_ffffffffffffffac,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  *(undefined4 *)(in_RDI[1].m_crctab + 6) = 0;
  in_RDI[1].m_crctab[7] = 0;
  in_RDI[1].m_crctab[8] = 0;
  DStarHeader::DStarHeader((DStarHeader *)CONCAT44(in_stack_ffffffffffffffb4,uVar1));
  DPRS::DPRS((DPRS *)0x124217);
  reset_header_strings((DSDDstar *)CONCAT44(in_stack_ffffffffffffffb4,uVar1));
  DStarSlowData::init((DStarSlowData *)(in_RDI[1].m_crctab + 0x1a),ctx);
  memset(in_RDI[1].m_crctab + 5,0,4);
  memset((void *)((long)in_RDI[1].m_crctab + 0x2c),0,4);
  return;
}

Assistant:

DSDDstar::DSDDstar(DSDDecoder *dsdDecoder) :
		m_dsdDecoder(dsdDecoder),
		m_voiceFrameCount(0),
		m_frameType(DStarVoiceFrame),
		m_symbolIndex(0),
		m_symbolIndexHD(0),
        m_viterbi(2, Viterbi::Poly23a, false),
        m_crc(CRC::PolyDStar16, 16, 0xffff, 0xffff, 1, 0, 0),
		slowdataIx(0),
		w(0),
		x(0)
{
    reset_header_strings();
    m_slowData.init();
    memset(nullBytes, 0, 4);
    memset(slowdata, 0, 4);
}